

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdJoin.cpp
# Opt level: O2

int CmdJoin(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  int *piVar1;
  pointer pIVar2;
  bool verbose;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  pointer pIVar6;
  string *__return_storage_ptr__;
  string *this;
  iterator __end3;
  vector<Interval,_std::allocator<Interval>_> intervals;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2f0;
  Interval first;
  IntervalFilterAllWithIds filtering;
  Interval combined;
  Interval second;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&first,"verbose",(allocator<char> *)&second);
  verbose = Rules::getBoolean(rules,(string *)&first,false);
  std::__cxx11::string::~string((string *)&first);
  CLI::getIds(&ids,cli);
  if (ids._M_t._M_impl.super__Rb_tree_header._M_node_count != 2) {
    this = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (this,"Two IDs must be specified. See \'timew help join\'.",(allocator<char> *)&first)
    ;
    __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(journal);
  flattenDatabase(database,rules);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_2f0,&ids._M_t);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            (&filtering,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2f0);
  getTracked(&intervals,database,rules,&filtering.super_IntervalFilter);
  pIVar2 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
            super__Vector_impl_data._M_start) / 0xc0 !=
      ids._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    for (p_Var4 = ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left; pIVar6 = pIVar2,
        (_Rb_tree_header *)p_Var4 != &ids._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      do {
        if (pIVar6 == intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&first,"ID \'@{1}\' does not correspond to any tracking.",
                     (allocator<char> *)&second);
          format<int>(__return_storage_ptr__,(string *)&first,p_Var4[1]._M_color);
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        piVar1 = &pIVar6->id;
        pIVar6 = pIVar6 + 1;
      } while (*piVar1 != p_Var4[1]._M_color);
    }
  }
  Interval::Interval(&first,pIVar2 + 1);
  Interval::Interval(&second,intervals.super__Vector_base<Interval,_std::allocator<Interval>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  Interval::Interval(&combined,&second);
  combined.super_Range.end._utc = first.super_Range.end._utc;
  combined.super_Range.end._33_7_ = first.super_Range.end._33_7_;
  combined.super_Range.end._date = first.super_Range.end._date;
  combined.super_Range.end._julian = first.super_Range.end._julian;
  combined.super_Range.end._day = first.super_Range.end._day;
  combined.super_Range.end._seconds = first.super_Range.end._seconds;
  combined.super_Range.end._offset = first.super_Range.end._offset;
  combined.super_Range.end._year = first.super_Range.end._year;
  combined.super_Range.end._month = first.super_Range.end._month;
  combined.super_Range.end._week = first.super_Range.end._week;
  combined.super_Range.end._weekday = first.super_Range.end._weekday;
  psVar3 = Interval::tags_abi_cxx11_(&first);
  for (p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    Interval::tag(&combined,(string *)(p_Var4 + 1));
  }
  Database::deleteInterval(database,&first);
  Database::deleteInterval(database,&second);
  validate(cli,rules,database,&combined);
  Database::addInterval(database,&combined,verbose);
  Journal::endTransaction(journal);
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Joined @");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,first.id);
    poVar5 = std::operator<<(poVar5," and @");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,second.id);
    std::operator<<(poVar5,'\n');
  }
  Interval::~Interval(&combined);
  Interval::~Interval(&second);
  Interval::~Interval(&first);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&intervals);
  IntervalFilterAllWithIds::~IntervalFilterAllWithIds(&filtering);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&ids._M_t);
  return 0;
}

Assistant:

int CmdJoin (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  // Gather IDs and TAGs.
  auto ids = cli.getIds ();

  // Only 2 IDs allowed in a join.
  if (ids.size () != 2)
  {
    throw std::string ("Two IDs must be specified. See 'timew help join'.");
  }

  journal.startTransaction ();

  flattenDatabase (database, rules);
  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  Interval first  = intervals[1];
  Interval second = intervals[0];

  // TODO Require confirmation if intervals are not consecutive.

  auto combined = second;
  combined.end = first.end;

  for (auto& tag: first.tags ())
  {
    combined.tag (tag);
  }

  database.deleteInterval (first);
  database.deleteInterval (second);

  validate (cli, rules, database, combined);
  database.addInterval (combined, verbose);

  journal.endTransaction ();

  if (verbose)
  {
    std::cout << "Joined @" << first.id << " and @" << second.id << '\n';
  }

  return 0;
}